

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_PlaneEquation::Create(ON_PlaneEquation *this,ON_3dPoint P,ON_3dVector N)

{
  bool bVar1;
  double dVar2;
  bool local_39;
  ON_3dVector *v;
  bool rc;
  ON_PlaneEquation *this_local;
  
  v._7_1_ = false;
  bVar1 = ON_3dPoint::IsValid(&P);
  if ((bVar1) && (bVar1 = ON_3dVector::IsValid(&N), bVar1)) {
    this->x = N.x;
    this->y = N.y;
    this->z = N.z;
    dVar2 = ON_3dVector::Length((ON_3dVector *)this);
    if (ABS(1.0 - dVar2) <= 2.3283064365386963e-10) {
      local_39 = true;
    }
    else {
      local_39 = ON_3dVector::Unitize((ON_3dVector *)this);
    }
    v._7_1_ = local_39;
    this->d = -(this->z * P.z + this->x * P.x + this->y * P.y);
  }
  return v._7_1_;
}

Assistant:

bool ON_PlaneEquation::Create( ON_3dPoint P, ON_3dVector N )
{
  bool rc = false;
  if ( P.IsValid() && N.IsValid() )
  {
    x = N.x;
    y = N.y;
    z = N.z;
    ON_3dVector* v = (ON_3dVector*)&x;
    rc = (fabs(1.0 - v->Length()) > ON_ZERO_TOLERANCE) ? v->Unitize() : true;
    d = -(x*P.x + y*P.y + z*P.z);
  }
  return rc;
}